

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# syntax_tests.cpp
# Opt level: O0

void __thiscall
syntax_tests::iu_SyntaxTest_x_iutest_x_AlmostComplexEq_Test::Body
          (iu_SyntaxTest_x_iutest_x_AlmostComplexEq_Test *this)

{
  bool bVar1;
  char *pcVar2;
  complex<double> *in_R9;
  AssertionHelper local_7f8;
  Fixed local_7c8;
  complex<double> local_640;
  undefined1 local_630 [8];
  AssertionResult iutest_ar_3;
  double x_3;
  Fixed local_5d0;
  complex<double> local_448;
  undefined1 local_438 [8];
  AssertionResult iutest_ar_2;
  double x_2;
  Fixed local_3d8;
  undefined1 local_250 [8];
  AssertionResult iutest_ar_1;
  double x_1;
  AssertionHelper local_218;
  Fixed local_1e8;
  undefined1 local_50 [8];
  AssertionResult iutest_ar;
  double x;
  complex<double> c;
  iu_SyntaxTest_x_iutest_x_AlmostComplexEq_Test *this_local;
  
  c._M_value._8_8_ = this;
  std::complex<double>::complex((complex<double> *)&x,1.0,0.0);
  iutest_ar.m_result = false;
  iutest_ar._33_7_ = 0x3ff00000000000;
  iutest::detail::AlwaysZero();
  iutest::internal::backward::AlmostEqHelper<false>::Compare<double,double>
            ((AssertionResult *)local_50,(AlmostEqHelper<false> *)0x54bb45,"x",(char *)&x,
             (complex<double> *)&iutest_ar.m_result,(double *)in_R9);
  bVar1 = iutest::AssertionResult::operator_cast_to_bool((AssertionResult *)local_50);
  if (!bVar1) {
    memset(&local_1e8,0,0x188);
    iutest::AssertionHelper::Fixed::Fixed(&local_1e8);
    pcVar2 = iutest::AssertionResult::message((AssertionResult *)local_50);
    iutest::AssertionHelper::AssertionHelper
              (&local_218,
               "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/syntax_tests.cpp"
               ,0x159,pcVar2,kFatalFailure);
    iutest::AssertionHelper::operator=(&local_218,&local_1e8);
    iutest::AssertionHelper::~AssertionHelper(&local_218);
    iutest::AssertionHelper::Fixed::~Fixed(&local_1e8);
  }
  iutest::AssertionResult::~AssertionResult((AssertionResult *)local_50);
  if (bVar1) {
    iutest_ar_1.m_result = false;
    iutest_ar_1._33_7_ = 0x3ff00000000000;
    iutest::detail::AlwaysZero();
    iutest::internal::backward::AlmostEqHelper<false>::Compare<double,double>
              ((AssertionResult *)local_250,(AlmostEqHelper<false> *)0x556818,"c",
               &iutest_ar_1.m_result,&x,in_R9);
    bVar1 = iutest::AssertionResult::operator_cast_to_bool((AssertionResult *)local_250);
    if (!bVar1) {
      memset(&local_3d8,0,0x188);
      iutest::AssertionHelper::Fixed::Fixed(&local_3d8);
      pcVar2 = iutest::AssertionResult::message((AssertionResult *)local_250);
      iutest::AssertionHelper::AssertionHelper
                ((AssertionHelper *)&x_2,
                 "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/syntax_tests.cpp"
                 ,0x15b,pcVar2,kNonFatalFailure);
      iutest::AssertionHelper::operator=((AssertionHelper *)&x_2,&local_3d8);
      iutest::AssertionHelper::~AssertionHelper((AssertionHelper *)&x_2);
      iutest::AssertionHelper::Fixed::~Fixed(&local_3d8);
    }
    iutest::AssertionResult::~AssertionResult((AssertionResult *)local_250);
    iutest_ar_2.m_result = false;
    iutest_ar_2._33_7_ = 0x3ff00000000000;
    iutest::detail::AlwaysZero();
    std::complex<double>::complex(&local_448,(double)iutest_ar_2._32_8_,(double)iutest_ar_2._32_8_);
    iutest::internal::backward::AlmostEqHelper<false>::Compare<double,double>
              ((AssertionResult *)local_438,(AlmostEqHelper<false> *)"::std::complex<double>(x, x)",
               "c",(char *)&local_448,(complex<double> *)&x,in_R9);
    bVar1 = iutest::AssertionResult::operator_cast_to_bool((AssertionResult *)local_438);
    if (!bVar1) {
      memset(&local_5d0,0,0x188);
      iutest::AssertionHelper::Fixed::Fixed(&local_5d0);
      pcVar2 = iutest::AssertionResult::message((AssertionResult *)local_438);
      iutest::AssertionHelper::AssertionHelper
                ((AssertionHelper *)&x_3,
                 "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/syntax_tests.cpp"
                 ,0x15d,pcVar2,kWarning);
      iutest::AssertionHelper::operator=((AssertionHelper *)&x_3,&local_5d0);
      iutest::AssertionHelper::~AssertionHelper((AssertionHelper *)&x_3);
      iutest::AssertionHelper::Fixed::~Fixed(&local_5d0);
    }
    iutest::AssertionResult::~AssertionResult((AssertionResult *)local_438);
    iutest_ar_3.m_result = false;
    iutest_ar_3._33_7_ = 0x3ff00000000000;
    iutest::detail::AlwaysZero();
    std::complex<double>::complex(&local_640,(double)iutest_ar_3._32_8_,(double)iutest_ar_3._32_8_);
    iutest::internal::backward::AlmostEqHelper<false>::Compare<double,double>
              ((AssertionResult *)local_630,(AlmostEqHelper<false> *)0x54bb45,
               "::std::complex<double>(x, x)",(char *)&x,&local_640,in_R9);
    bVar1 = iutest::AssertionResult::operator_cast_to_bool((AssertionResult *)local_630);
    if (!bVar1) {
      memset(&local_7c8,0,0x188);
      iutest::AssertionHelper::Fixed::Fixed(&local_7c8);
      pcVar2 = iutest::AssertionResult::message((AssertionResult *)local_630);
      iutest::AssertionHelper::AssertionHelper
                (&local_7f8,
                 "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/syntax_tests.cpp"
                 ,0x15f,pcVar2,kAssumeFailure);
      iutest::AssertionHelper::operator=(&local_7f8,&local_7c8);
      iutest::AssertionHelper::~AssertionHelper(&local_7f8);
      iutest::AssertionHelper::Fixed::~Fixed(&local_7c8);
    }
    iutest::AssertionResult::~AssertionResult((AssertionResult *)local_630);
  }
  return;
}

Assistant:

IUTEST(SyntaxTest, AlmostComplexEq)
{
    ::std::complex<double> c(1.0, 0.0);
    if( double x = 1.0 )
        IUTEST_ASSERT_ALMOST_EQ(c, x);
    if( double x = 1.0 )
        IUTEST_EXPECT_ALMOST_EQ(x, c);
    if( double x = 1.0 )
        IUTEST_INFORM_ALMOST_EQ(::std::complex<double>(x, x), c);
    if( double x = 1.0 )
        IUTEST_ASSUME_ALMOST_EQ(c, ::std::complex<double>(x, x));
}